

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O3

int __thiscall
QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
::remove(QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
         *this,char *__filename)

{
  long lVar1;
  containers *pcVar2;
  iterator it;
  const_iterator cVar3;
  iterator iVar4;
  
  cVar3 = find(this,(QPushButton **)__filename);
  it.i = cVar3.i;
  pcVar2 = cVar3.c;
  lVar1 = (this->c).keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.s;
  if (lVar1 != it.i) {
    it.c = &this->c;
    iVar4 = erase(this,it);
    pcVar2 = iVar4.c;
  }
  return (int)CONCAT71((int7)((ulong)pcVar2 >> 8),lVar1 != it.i);
}

Assistant:

bool remove(const Key &key)
    {
        return do_remove(find(key));
    }